

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getLeaveVals2(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *leaveMax,SPxId enterId,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *enterBound,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newUBbound,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newLBbound,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newCoPrhs,
               StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *objChange)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  pointer pnVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  long lVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  int32_t iVar27;
  int iVar28;
  Status SVar29;
  pointer pnVar30;
  ostream *poVar31;
  undefined8 *puVar32;
  cpp_dec_float<100U,_int,_void> *pcVar33;
  cpp_dec_float<100U,_int,_void> *pcVar34;
  long lVar35;
  long lVar36;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_158;
  double local_108;
  undefined8 uStack_100;
  cpp_dec_float<100U,_int,_void> local_f8;
  cpp_dec_float<100U,_int,_void> local_a8;
  DataKey local_50;
  double local_48;
  undefined8 uStack_40;
  
  this_00 = &this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_50 = enterId.super_DataKey;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&enterBound->m_backend,0);
  pcVar34 = &newCoPrhs->m_backend;
  if (enterId.super_DataKey.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_158,(SPxId *)&local_50);
    iVar28 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_158);
    lVar36 = (long)iVar28;
    local_108 = (double)lVar36;
    switch((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data[lVar36]) {
    case D_FREE:
      pnVar30 = (this->thePvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar35 = lVar36 * 0x50;
      local_f8.data._M_elems._0_8_ = *(undefined8 *)&pnVar30[lVar36].m_backend.data;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar30[lVar36].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x10);
      local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x20);
      local_f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x30);
      local_f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_f8.exp = pnVar30[lVar36].m_backend.exp;
      local_f8.neg = pnVar30[lVar36].m_backend.neg;
      local_f8.fpclass = pnVar30[lVar36].m_backend.fpclass;
      local_f8.prec_elem = pnVar30[lVar36].m_backend.prec_elem;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 0x10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems[6] = 0;
      local_a8.data._M_elems[7] = 0;
      local_a8.data._M_elems[8] = 0;
      local_a8.data._M_elems[9] = 0;
      local_a8.data._M_elems[10] = 0;
      local_a8.data._M_elems[0xb] = 0;
      local_a8.data._M_elems[0xc] = 0;
      local_a8.data._M_elems[0xd] = 0;
      local_a8.data._M_elems._56_5_ = 0;
      local_a8.data._M_elems[0xf]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      if (&local_a8 == &leaveMax->m_backend) {
        leaveMax = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_f8;
      }
      else {
        local_a8.data._M_elems._56_5_ = local_f8.data._M_elems._56_5_;
        local_a8.data._M_elems[0xf]._1_3_ = local_f8.data._M_elems[0xf]._1_3_;
        local_a8.prec_elem = local_f8.prec_elem;
        local_a8.fpclass = local_f8.fpclass;
        local_a8.data._M_elems._0_8_ = local_f8.data._M_elems._0_8_;
        local_a8.data._M_elems._8_8_ = local_f8.data._M_elems._8_8_;
        local_a8.data._M_elems._16_8_ = local_f8.data._M_elems._16_8_;
        local_a8.data._M_elems._24_8_ = local_f8.data._M_elems._24_8_;
        local_a8.data._M_elems._32_8_ = local_f8.data._M_elems._32_8_;
        local_a8.data._M_elems._40_8_ = local_f8.data._M_elems._40_8_;
        local_a8.data._M_elems._48_8_ = local_f8.data._M_elems._48_8_;
        local_a8.exp = local_f8.exp;
        local_a8.neg = local_f8.neg;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_a8,&leaveMax->m_backend);
      if (local_a8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_158,0,(type *)0x0);
        iVar28 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_a8,&local_158);
        if (iVar28 < 0) {
          lVar36 = 0xba8;
          goto LAB_0039e4cb;
        }
      }
      lVar36 = 0xb90;
LAB_0039e4cb:
      lVar36 = *(long *)((long)&(this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray + lVar36);
      uVar12 = *(undefined8 *)(lVar36 + lVar35);
      uVar21 = ((undefined8 *)(lVar36 + lVar35))[1];
      puVar32 = (undefined8 *)(lVar36 + 0x10 + lVar35);
      uVar22 = *puVar32;
      uVar23 = puVar32[1];
      puVar32 = (undefined8 *)(lVar36 + 0x20 + lVar35);
      uVar24 = *puVar32;
      uVar25 = puVar32[1];
      puVar32 = (undefined8 *)(lVar36 + 0x30 + lVar35);
      uVar26 = puVar32[1];
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *puVar32;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = *(int *)(lVar36 + 0x40 + lVar35);
      (newCoPrhs->m_backend).neg = *(bool *)(lVar36 + 0x44 + lVar35);
      uVar12 = *(undefined8 *)(lVar36 + 0x48 + lVar35);
      (newCoPrhs->m_backend).fpclass = (int)uVar12;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar12 >> 0x20);
      ::soplex::infinity::__tls_init();
      local_48 = *(double *)(in_FS_OFFSET + -8);
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      uStack_40 = 0;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,local_48);
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newUBbound->m_backend).exp = local_158.exp;
      (newUBbound->m_backend).neg = local_158.neg;
      (newUBbound->m_backend).fpclass = local_158.fpclass;
      (newUBbound->m_backend).prec_elem = local_158.prec_elem;
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,-local_48);
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newLBbound->m_backend).exp = local_158.exp;
      (newLBbound->m_backend).neg = local_158.neg;
      (newLBbound->m_backend).fpclass = local_158.fpclass;
      (newLBbound->m_backend).prec_elem = local_158.prec_elem;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[(long)local_108] = P_FIXED;
      return;
    case D_ON_UPPER:
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&newUBbound->m_backend,0);
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,-*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newLBbound->m_backend).exp = local_158.exp;
      (newLBbound->m_backend).neg = local_158.neg;
      (newLBbound->m_backend).fpclass = local_158.fpclass;
      (newLBbound->m_backend).prec_elem = local_158.prec_elem;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[lVar36] = P_ON_LOWER;
      pnVar30 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_0039d842;
    case D_ON_LOWER:
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newUBbound->m_backend).exp = local_158.exp;
      (newUBbound->m_backend).neg = local_158.neg;
      (newUBbound->m_backend).fpclass = local_158.fpclass;
      (newUBbound->m_backend).prec_elem = local_158.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[lVar36] = P_ON_UPPER;
      pnVar30 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_0039da4f;
    case D_ON_BOTH:
      pnVar30 = (this->thePvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar35 = lVar36 * 0x50;
      local_f8.data._M_elems._0_8_ = *(undefined8 *)&pnVar30[lVar36].m_backend.data;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar30[lVar36].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x10);
      local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x20);
      local_f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x30);
      local_f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_f8.exp = pnVar30[lVar36].m_backend.exp;
      local_f8.neg = pnVar30[lVar36].m_backend.neg;
      local_f8.fpclass = pnVar30[lVar36].m_backend.fpclass;
      local_f8.prec_elem = pnVar30[lVar36].m_backend.prec_elem;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 0x10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems[6] = 0;
      local_a8.data._M_elems[7] = 0;
      local_a8.data._M_elems[8] = 0;
      local_a8.data._M_elems[9] = 0;
      local_a8.data._M_elems[10] = 0;
      local_a8.data._M_elems[0xb] = 0;
      local_a8.data._M_elems[0xc] = 0;
      local_a8.data._M_elems[0xd] = 0;
      local_a8.data._M_elems._56_5_ = 0;
      local_a8.data._M_elems[0xf]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      if (&local_a8 != &leaveMax->m_backend) {
        local_a8.data._M_elems._0_8_ = *(undefined8 *)(leaveMax->m_backend).data._M_elems;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 2);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 4);
        local_a8.data._M_elems._24_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 6);
        local_a8.data._M_elems._32_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 8);
        local_a8.data._M_elems._40_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 10);
        local_a8.data._M_elems._48_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 0xc);
        uVar12 = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 0xe);
        local_a8.data._M_elems._56_5_ = SUB85(uVar12,0);
        local_a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
        local_a8.exp = (leaveMax->m_backend).exp;
        local_a8.neg = (leaveMax->m_backend).neg;
        local_a8.fpclass = (leaveMax->m_backend).fpclass;
        local_a8.prec_elem = (leaveMax->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_a8,&local_f8);
      if (local_a8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_158,0,(type *)0x0);
        iVar28 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_a8,&local_158);
        if (iVar28 < 0) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&newUBbound->m_backend,0);
          ::soplex::infinity::__tls_init();
          local_158.fpclass = cpp_dec_float_finite;
          local_158.prec_elem = 0x10;
          local_158.data._M_elems[0] = 0;
          local_158.data._M_elems[1] = 0;
          local_158.data._M_elems[2] = 0;
          local_158.data._M_elems[3] = 0;
          local_158.data._M_elems[4] = 0;
          local_158.data._M_elems[5] = 0;
          local_158.data._M_elems[6] = 0;
          local_158.data._M_elems[7] = 0;
          local_158.data._M_elems[8] = 0;
          local_158.data._M_elems[9] = 0;
          local_158.data._M_elems[10] = 0;
          local_158.data._M_elems[0xb] = 0;
          local_158.data._M_elems[0xc] = 0;
          local_158.data._M_elems[0xd] = 0;
          local_158.data._M_elems[0xe] = 0;
          local_158.data._M_elems[0xf] = 0;
          local_158.exp = 0;
          local_158.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_158,-*(double *)(in_FS_OFFSET + -8));
          *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_
          ;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) =
               local_158.data._M_elems._16_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) =
               local_158.data._M_elems._24_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) =
               local_158.data._M_elems._32_8_;
          *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
               CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
          *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
               CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
          *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
               CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
          (newLBbound->m_backend).exp = local_158.exp;
          (newLBbound->m_backend).neg = local_158.neg;
          (newLBbound->m_backend).fpclass = local_158.fpclass;
          (newLBbound->m_backend).prec_elem = local_158.prec_elem;
          (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.rowstat.data[(long)local_108] = P_ON_LOWER;
          pnVar30 = (this->theLRbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_0039e905;
        }
      }
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newUBbound->m_backend).exp = local_158.exp;
      (newUBbound->m_backend).neg = local_158.neg;
      (newUBbound->m_backend).fpclass = local_158.fpclass;
      (newUBbound->m_backend).prec_elem = local_158.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[(long)local_108] = P_ON_UPPER;
      pnVar30 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_0039d73b;
    case P_FIXED:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE54 ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR! Tried to put a fixed row variable into the basis: ",
                 0x39);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
      poVar31 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar31,", lhs=",6);
      poVar31 = boost::multiprecision::operator<<
                          (poVar31,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .left.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar36);
      std::__ostream_insert<char,std::char_traits<char>>(poVar31,", rhs=",6);
      poVar31 = boost::multiprecision::operator<<
                          (poVar31,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .right.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar36);
      std::endl<char,std::char_traits<char>>(poVar31);
      puVar32 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_158.data._M_elems._0_8_ = local_158.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"XLEAVE05 This should never happen.","");
      *puVar32 = &PTR__SPxException_0069d438;
      puVar32[1] = puVar32 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar32 + 1),local_158.data._M_elems._0_8_,
                 local_158.data._M_elems._0_8_ + local_158.data._M_elems._8_8_);
      *puVar32 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar32,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar32 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_158.data._M_elems._0_8_ = local_158.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"XLEAVE06 This should never happen.","");
      *puVar32 = &PTR__SPxException_0069d438;
      puVar32[1] = puVar32 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar32 + 1),local_158.data._M_elems._0_8_,
                 local_158.data._M_elems._0_8_ + local_158.data._M_elems._8_8_);
      *puVar32 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar32,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar29 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualRowStatus(this_00,iVar28);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[lVar36] = SVar29;
      pcVar33 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar36].m_backend;
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,*(double *)(in_FS_OFFSET + -8));
      if (((pcVar33->fpclass != cpp_dec_float_NaN) && (local_158.fpclass != cpp_dec_float_NaN)) &&
         (iVar28 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar33,&local_158), iVar28 < 0)) {
        pnVar30 = (this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar13 = (this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
        uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
        uVar22 = *(undefined8 *)puVar1;
        uVar23 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
        uVar24 = *(undefined8 *)puVar1;
        uVar25 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
        uVar26 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar26;
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = uVar24;
        *(undefined8 *)(puVar1 + 2) = uVar25;
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = uVar22;
        *(undefined8 *)(puVar1 + 2) = uVar23;
        *(undefined8 *)&pnVar13[(long)local_108].m_backend.data = uVar12;
        *(undefined8 *)((long)&pnVar13[(long)local_108].m_backend.data + 8) = uVar21;
        pnVar13[(long)local_108].m_backend.exp = pnVar30[(long)local_108].m_backend.exp;
        pnVar13[(long)local_108].m_backend.neg = pnVar30[(long)local_108].m_backend.neg;
        iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
        pnVar13[(long)local_108].m_backend.fpclass = pnVar30[(long)local_108].m_backend.fpclass;
        pnVar13[(long)local_108].m_backend.prec_elem = iVar27;
      }
      pnVar30 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = pnVar30[(long)local_108].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar30[(long)local_108].m_backend.neg;
      iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar30[(long)local_108].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar27;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = pnVar30[(long)local_108].m_backend.data._M_elems[0];
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar12 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x24);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xb] = (uint)((ulong)uVar22 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x14);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 4);
      uVar25 = *(undefined8 *)puVar1;
      uVar26 = *(undefined8 *)(puVar1 + 2);
      iVar28 = pnVar30[(long)local_108].m_backend.exp;
      uVar9 = pnVar30[(long)local_108].m_backend.fpclass;
      uVar17 = pnVar30[(long)local_108].m_backend.prec_elem;
      bVar4 = pnVar30[(long)local_108].m_backend.neg;
      (newLBbound->m_backend).data._M_elems[0] = uVar5;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 1) = uVar25;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 3) = uVar26;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 5) = uVar23;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 7) = uVar24;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 9) = uVar21;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xb) = uVar22;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xc],local_158.data._M_elems[0xb]);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar12;
      (newLBbound->m_backend).exp = iVar28;
      (newLBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar9 != 0) ^ bVar4);
      (newLBbound->m_backend).fpclass = uVar9;
      (newLBbound->m_backend).prec_elem = uVar17;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = pnVar30[(long)local_108].m_backend.data._M_elems[0];
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar12 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x24);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xb] = (uint)((ulong)uVar22 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x14);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 4);
      uVar25 = *(undefined8 *)puVar1;
      uVar26 = *(undefined8 *)(puVar1 + 2);
      uVar10 = pnVar30[(long)local_108].m_backend.fpclass;
      uVar18 = pnVar30[(long)local_108].m_backend.prec_elem;
      bVar4 = pnVar30[(long)local_108].m_backend.neg;
      iVar28 = pnVar30[(long)local_108].m_backend.exp;
      (newUBbound->m_backend).data._M_elems[0] = uVar5;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 1) = uVar25;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 3) = uVar26;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 5) = uVar23;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 7) = uVar24;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 9) = uVar21;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xb) = uVar22;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xc],local_158.data._M_elems[0xb]);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar12;
      (newUBbound->m_backend).exp = iVar28;
      (newUBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar10 != 0) ^ bVar4);
      (newUBbound->m_backend).fpclass = uVar10;
      (newUBbound->m_backend).prec_elem = uVar18;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = pnVar30[(long)local_108].m_backend.data._M_elems[0];
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar12 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x24);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xb] = (uint)((ulong)uVar22 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x14);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 4);
      uVar25 = *(undefined8 *)puVar1;
      uVar26 = *(undefined8 *)(puVar1 + 2);
      iVar28 = pnVar30[(long)local_108].m_backend.exp;
      uVar11 = pnVar30[(long)local_108].m_backend.fpclass;
      uVar19 = pnVar30[(long)local_108].m_backend.prec_elem;
      bVar4 = pnVar30[(long)local_108].m_backend.neg;
      (enterBound->m_backend).data._M_elems[0] = uVar5;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 1) = uVar25;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 3) = uVar26;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 5) = uVar23;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 7) = uVar24;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 9) = uVar21;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xb) = uVar22;
      *(ulong *)((enterBound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xc],local_158.data._M_elems[0xb]);
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xe) = uVar12;
      (enterBound->m_backend).exp = iVar28;
      (enterBound->m_backend).neg = (bool)((uVar5 != 0 || uVar11 != 0) ^ bVar4);
      (enterBound->m_backend).fpclass = uVar11;
      (enterBound->m_backend).prec_elem = uVar19;
      pcVar33 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)local_108].m_backend;
      break;
    case P_ON_UPPER:
      SVar29 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualRowStatus(this_00,iVar28);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[lVar36] = SVar29;
      pcVar33 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar36].m_backend;
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,-*(double *)(in_FS_OFFSET + -8));
      if (((pcVar33->fpclass != cpp_dec_float_NaN) && (local_158.fpclass != cpp_dec_float_NaN)) &&
         (iVar28 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar33,&local_158), 0 < iVar28)) {
        pnVar30 = (this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar13 = (this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = *(undefined8 *)&pnVar13[(long)local_108].m_backend.data;
        uVar21 = *(undefined8 *)((long)&pnVar13[(long)local_108].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x10);
        uVar22 = *(undefined8 *)puVar1;
        uVar23 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x20);
        uVar24 = *(undefined8 *)puVar1;
        uVar25 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x30);
        uVar26 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar26;
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = uVar24;
        *(undefined8 *)(puVar1 + 2) = uVar25;
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = uVar22;
        *(undefined8 *)(puVar1 + 2) = uVar23;
        *(undefined8 *)&pnVar30[(long)local_108].m_backend.data = uVar12;
        *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8) = uVar21;
        pnVar30[(long)local_108].m_backend.exp = pnVar13[(long)local_108].m_backend.exp;
        pnVar30[(long)local_108].m_backend.neg = pnVar13[(long)local_108].m_backend.neg;
        iVar27 = pnVar13[(long)local_108].m_backend.prec_elem;
        pnVar30[(long)local_108].m_backend.fpclass = pnVar13[(long)local_108].m_backend.fpclass;
        pnVar30[(long)local_108].m_backend.prec_elem = iVar27;
      }
      pnVar30 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = pnVar30[(long)local_108].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar30[(long)local_108].m_backend.neg;
      iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar30[(long)local_108].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar27;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = pnVar30[(long)local_108].m_backend.data._M_elems[0];
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar12 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x24);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xb] = (uint)((ulong)uVar22 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x14);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 4);
      uVar25 = *(undefined8 *)puVar1;
      uVar26 = *(undefined8 *)(puVar1 + 2);
      iVar28 = pnVar30[(long)local_108].m_backend.exp;
      uVar6 = pnVar30[(long)local_108].m_backend.fpclass;
      uVar14 = pnVar30[(long)local_108].m_backend.prec_elem;
      bVar4 = pnVar30[(long)local_108].m_backend.neg;
      (newUBbound->m_backend).data._M_elems[0] = uVar5;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 1) = uVar25;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 3) = uVar26;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 5) = uVar23;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 7) = uVar24;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 9) = uVar21;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xb) = uVar22;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xc],local_158.data._M_elems[0xb]);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar12;
      (newUBbound->m_backend).exp = iVar28;
      (newUBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar6 != 0) ^ bVar4);
      (newUBbound->m_backend).fpclass = uVar6;
      (newUBbound->m_backend).prec_elem = uVar14;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = pnVar30[(long)local_108].m_backend.data._M_elems[0];
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar12 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x24);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xb] = (uint)((ulong)uVar22 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x14);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 4);
      uVar25 = *(undefined8 *)puVar1;
      uVar26 = *(undefined8 *)(puVar1 + 2);
      uVar7 = pnVar30[(long)local_108].m_backend.fpclass;
      uVar15 = pnVar30[(long)local_108].m_backend.prec_elem;
      bVar4 = pnVar30[(long)local_108].m_backend.neg;
      iVar28 = pnVar30[(long)local_108].m_backend.exp;
      (newLBbound->m_backend).data._M_elems[0] = uVar5;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 1) = uVar25;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 3) = uVar26;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 5) = uVar23;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 7) = uVar24;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 9) = uVar21;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xb) = uVar22;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xc],local_158.data._M_elems[0xb]);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar12;
      (newLBbound->m_backend).exp = iVar28;
      (newLBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar7 != 0) ^ bVar4);
      (newLBbound->m_backend).fpclass = uVar7;
      (newLBbound->m_backend).prec_elem = uVar15;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = pnVar30[(long)local_108].m_backend.data._M_elems[0];
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar12 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x24);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[0xb] = (uint)((ulong)uVar22 >> 0x20);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x14);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 4);
      uVar25 = *(undefined8 *)puVar1;
      uVar26 = *(undefined8 *)(puVar1 + 2);
      iVar28 = pnVar30[(long)local_108].m_backend.exp;
      uVar8 = pnVar30[(long)local_108].m_backend.fpclass;
      uVar16 = pnVar30[(long)local_108].m_backend.prec_elem;
      bVar4 = pnVar30[(long)local_108].m_backend.neg;
      (enterBound->m_backend).data._M_elems[0] = uVar5;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 1) = uVar25;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 3) = uVar26;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 5) = uVar23;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 7) = uVar24;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 9) = uVar21;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xb) = uVar22;
      *(ulong *)((enterBound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xc],local_158.data._M_elems[0xb]);
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xe) = uVar12;
      (enterBound->m_backend).exp = iVar28;
      (enterBound->m_backend).neg = (bool)((uVar5 != 0 || uVar8 != 0) ^ bVar4);
      (enterBound->m_backend).fpclass = uVar8;
      (enterBound->m_backend).prec_elem = uVar16;
      pcVar33 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)local_108].m_backend;
      break;
    case P_FREE:
      puVar32 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_158.data._M_elems._0_8_ = local_158.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"XLEAVE04 This should never happen.","");
      *puVar32 = &PTR__SPxException_0069d438;
      puVar32[1] = puVar32 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar32 + 1),local_158.data._M_elems._0_8_,
                 local_158.data._M_elems._0_8_ + local_158.data._M_elems._8_8_);
      *puVar32 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar32,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_158.fpclass = cpp_dec_float_finite;
    local_158.prec_elem = 0x10;
    local_158.data._M_elems[0] = 0;
    local_158.data._M_elems[1] = 0;
    local_158.data._M_elems[2] = 0;
    local_158.data._M_elems[3] = 0;
    local_158.data._M_elems[4] = 0;
    local_158.data._M_elems[5] = 0;
    local_158.data._M_elems[6] = 0;
    local_158.data._M_elems[7] = 0;
    local_158.data._M_elems[8] = 0;
    local_158.data._M_elems[9] = 0;
    local_158.data._M_elems[10] = 0;
    local_158.data._M_elems[0xb] = 0;
    local_158.data._M_elems[0xc] = 0;
    local_158.data._M_elems[0xd] = 0;
    local_158.data._M_elems[0xe] = 0;
    local_158.data._M_elems[0xf] = 0;
    local_158.exp = 0;
    local_158.neg = false;
    if ((&local_158 != pcVar33) && (pcVar34 = pcVar33, &local_158 != &newCoPrhs->m_backend)) {
      local_158.data._M_elems._0_8_ = *(undefined8 *)(newCoPrhs->m_backend).data._M_elems;
      local_158.data._M_elems._8_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2);
      local_158.data._M_elems._16_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4);
      local_158.data._M_elems._24_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6);
      local_158.data._M_elems._32_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8);
      uVar12 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10);
      uVar21 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc);
      uVar22 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe);
      local_158.data._M_elems[0xc] = (uint)uVar21;
      local_158.data._M_elems[0xd] = (uint)((ulong)uVar21 >> 0x20);
      local_158.data._M_elems[0xe] = (uint)uVar22;
      local_158.data._M_elems[0xf] = (uint)((ulong)uVar22 >> 0x20);
      local_158.data._M_elems[10] = (uint)uVar12;
      local_158.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
      local_158.exp = (newCoPrhs->m_backend).exp;
      local_158.neg = (newCoPrhs->m_backend).neg;
      local_158.fpclass = (newCoPrhs->m_backend).fpclass;
      local_158.prec_elem = (newCoPrhs->m_backend).prec_elem;
    }
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_158,(SPxId *)&local_50);
    iVar28 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_158);
    lVar36 = (long)iVar28;
    local_108 = (double)lVar36;
    switch((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.colstat.data[lVar36]) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      local_108 = *(double *)(in_FS_OFFSET + -8);
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      uStack_100 = 0;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,local_108);
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newUBbound->m_backend).exp = local_158.exp;
      (newUBbound->m_backend).neg = local_158.neg;
      (newUBbound->m_backend).fpclass = local_158.fpclass;
      (newUBbound->m_backend).prec_elem = local_158.prec_elem;
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,-local_108);
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newLBbound->m_backend).exp = local_158.exp;
      (newLBbound->m_backend).neg = local_158.neg;
      (newLBbound->m_backend).fpclass = local_158.fpclass;
      (newLBbound->m_backend).prec_elem = local_158.prec_elem;
      pnVar30 = (this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[lVar36].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[lVar36].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = pnVar30[lVar36].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar30[lVar36].m_backend.neg;
      iVar27 = pnVar30[lVar36].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar30[lVar36].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar27;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar36] = P_FIXED;
      return;
    case D_ON_UPPER:
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&newUBbound->m_backend,0);
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,-*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newLBbound->m_backend).exp = local_158.exp;
      (newLBbound->m_backend).neg = local_158.neg;
      (newLBbound->m_backend).fpclass = local_158.fpclass;
      (newLBbound->m_backend).prec_elem = local_158.prec_elem;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar36] = P_ON_LOWER;
      pnVar30 = (this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_0039d842:
      uVar12 = *(undefined8 *)&pnVar30[lVar36].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[lVar36].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
LAB_0039da81:
      (newCoPrhs->m_backend).exp = *(int *)((long)(pnVar30 + lVar36) + 0x40);
      (newCoPrhs->m_backend).neg = *(bool *)((long)(pnVar30 + lVar36) + 0x44);
      uVar12 = *(undefined8 *)((long)(pnVar30 + lVar36) + 0x48);
      (newCoPrhs->m_backend).fpclass = (int)uVar12;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar12 >> 0x20);
      return;
    case D_ON_LOWER:
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newUBbound->m_backend).exp = local_158.exp;
      (newUBbound->m_backend).neg = local_158.neg;
      (newUBbound->m_backend).fpclass = local_158.fpclass;
      (newUBbound->m_backend).prec_elem = local_158.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar36] = P_ON_UPPER;
      pnVar30 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_0039da4f:
      uVar12 = *(undefined8 *)((long)&pnVar30[lVar36].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)puVar1;
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems =
           *(undefined8 *)&pnVar30[lVar36].m_backend.data;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
      goto LAB_0039da81;
    case D_ON_BOTH:
      pnVar30 = (this->theCoPvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar35 = lVar36 * 0x50;
      local_f8.data._M_elems._0_8_ = *(undefined8 *)&pnVar30[lVar36].m_backend.data;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar30[lVar36].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x10);
      local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x20);
      local_f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x30);
      local_f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_f8.exp = pnVar30[lVar36].m_backend.exp;
      local_f8.neg = pnVar30[lVar36].m_backend.neg;
      local_f8.fpclass = pnVar30[lVar36].m_backend.fpclass;
      local_f8.prec_elem = pnVar30[lVar36].m_backend.prec_elem;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 0x10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems[6] = 0;
      local_a8.data._M_elems[7] = 0;
      local_a8.data._M_elems[8] = 0;
      local_a8.data._M_elems[9] = 0;
      local_a8.data._M_elems[10] = 0;
      local_a8.data._M_elems[0xb] = 0;
      local_a8.data._M_elems[0xc] = 0;
      local_a8.data._M_elems[0xd] = 0;
      local_a8.data._M_elems._56_5_ = 0;
      local_a8.data._M_elems[0xf]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      if (&local_a8 != &leaveMax->m_backend) {
        local_a8.data._M_elems._0_8_ = *(undefined8 *)(leaveMax->m_backend).data._M_elems;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 2);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 4);
        local_a8.data._M_elems._24_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 6);
        local_a8.data._M_elems._32_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 8);
        local_a8.data._M_elems._40_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 10);
        local_a8.data._M_elems._48_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 0xc);
        uVar12 = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 0xe);
        local_a8.data._M_elems._56_5_ = SUB85(uVar12,0);
        local_a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
        local_a8.exp = (leaveMax->m_backend).exp;
        local_a8.neg = (leaveMax->m_backend).neg;
        local_a8.fpclass = (leaveMax->m_backend).fpclass;
        local_a8.prec_elem = (leaveMax->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_a8,&local_f8);
      if (local_a8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_158,0,(type *)0x0);
        iVar28 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_a8,&local_158);
        if (iVar28 < 0) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&newUBbound->m_backend,0);
          ::soplex::infinity::__tls_init();
          local_158.fpclass = cpp_dec_float_finite;
          local_158.prec_elem = 0x10;
          local_158.data._M_elems[0] = 0;
          local_158.data._M_elems[1] = 0;
          local_158.data._M_elems[2] = 0;
          local_158.data._M_elems[3] = 0;
          local_158.data._M_elems[4] = 0;
          local_158.data._M_elems[5] = 0;
          local_158.data._M_elems[6] = 0;
          local_158.data._M_elems[7] = 0;
          local_158.data._M_elems[8] = 0;
          local_158.data._M_elems[9] = 0;
          local_158.data._M_elems[10] = 0;
          local_158.data._M_elems[0xb] = 0;
          local_158.data._M_elems[0xc] = 0;
          local_158.data._M_elems[0xd] = 0;
          local_158.data._M_elems[0xe] = 0;
          local_158.data._M_elems[0xf] = 0;
          local_158.exp = 0;
          local_158.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_158,-*(double *)(in_FS_OFFSET + -8));
          *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_
          ;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) =
               local_158.data._M_elems._16_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) =
               local_158.data._M_elems._24_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) =
               local_158.data._M_elems._32_8_;
          *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
               CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
          *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
               CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
          *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
               CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
          (newLBbound->m_backend).exp = local_158.exp;
          (newLBbound->m_backend).neg = local_158.neg;
          (newLBbound->m_backend).fpclass = local_158.fpclass;
          (newLBbound->m_backend).prec_elem = local_158.prec_elem;
          (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.colstat.data[(long)local_108] = P_ON_LOWER;
          pnVar30 = (this->theLCbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_0039e905:
          puVar32 = (undefined8 *)((long)&(pnVar30->m_backend).data + lVar35);
          uVar12 = *puVar32;
          uVar21 = puVar32[1];
          puVar32 = (undefined8 *)((long)&(pnVar30->m_backend).data + lVar35 + 0x10);
          uVar22 = *puVar32;
          uVar23 = puVar32[1];
          puVar32 = (undefined8 *)((long)&(pnVar30->m_backend).data + lVar35 + 0x20);
          uVar24 = *puVar32;
          uVar25 = puVar32[1];
          puVar32 = (undefined8 *)((long)&(pnVar30->m_backend).data + lVar35 + 0x30);
          uVar26 = puVar32[1];
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *puVar32;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar24;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar25;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar22;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar23;
          *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar12;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
          goto LAB_0039d769;
        }
      }
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_158.data._M_elems[0xb],local_158.data._M_elems[10]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_158.data._M_elems[0xd],local_158.data._M_elems[0xc]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_158.data._M_elems[0xf],local_158.data._M_elems[0xe]);
      (newUBbound->m_backend).exp = local_158.exp;
      (newUBbound->m_backend).neg = local_158.neg;
      (newUBbound->m_backend).fpclass = local_158.fpclass;
      (newUBbound->m_backend).prec_elem = local_158.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[(long)local_108] = P_ON_UPPER;
      pnVar30 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_0039d73b:
      puVar32 = (undefined8 *)((long)&(pnVar30->m_backend).data + lVar35);
      uVar12 = puVar32[1];
      puVar3 = (undefined8 *)((long)&(pnVar30->m_backend).data + lVar35 + 0x10);
      uVar21 = *puVar3;
      uVar22 = puVar3[1];
      puVar3 = (undefined8 *)((long)&(pnVar30->m_backend).data + lVar35 + 0x20);
      uVar23 = *puVar3;
      uVar24 = puVar3[1];
      puVar3 = (undefined8 *)((long)&(pnVar30->m_backend).data + lVar35 + 0x30);
      uVar25 = *puVar3;
      uVar26 = puVar3[1];
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = *puVar32;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
LAB_0039d769:
      (newCoPrhs->m_backend).exp = *(int *)((long)&(pnVar30->m_backend).data + lVar35 + 0x40);
      (newCoPrhs->m_backend).neg = *(bool *)((long)&(pnVar30->m_backend).data + lVar35 + 0x44);
      uVar12 = *(undefined8 *)((long)&(pnVar30->m_backend).data + lVar35 + 0x48);
      (newCoPrhs->m_backend).fpclass = (int)uVar12;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar12 >> 0x20);
      return;
    case P_FIXED:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE56 ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "ERROR! Tried to put a fixed column variable into the basis. ",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
      poVar31 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar31,", lower=",8);
      poVar31 = boost::multiprecision::operator<<
                          (poVar31,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .low.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar36);
      std::__ostream_insert<char,std::char_traits<char>>(poVar31,", upper=",8);
      poVar31 = boost::multiprecision::operator<<
                          (poVar31,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .up.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar36);
      std::endl<char,std::char_traits<char>>(poVar31);
      puVar32 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_158.data._M_elems._0_8_ = local_158.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"XLEAVE07 This should never happen.","");
      *puVar32 = &PTR__SPxException_0069d438;
      puVar32[1] = puVar32 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar32 + 1),local_158.data._M_elems._0_8_,
                 local_158.data._M_elems._0_8_ + local_158.data._M_elems._8_8_);
      *puVar32 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar32,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar32 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_158.data._M_elems._0_8_ = local_158.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"XLEAVE08 This should never happen.","");
      *puVar32 = &PTR__SPxException_0069d438;
      puVar32[1] = puVar32 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar32 + 1),local_158.data._M_elems._0_8_,
                 local_158.data._M_elems._0_8_ + local_158.data._M_elems._8_8_);
      *puVar32 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar32,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar29 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar28);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar36] = SVar29;
      pcVar33 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar36].m_backend;
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,*(double *)(in_FS_OFFSET + -8));
      if (((pcVar33->fpclass != cpp_dec_float_NaN) && (local_158.fpclass != cpp_dec_float_NaN)) &&
         (iVar28 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar33,&local_158), iVar28 < 0)) {
        pnVar30 = (this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar13 = (this->theLCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = *(undefined8 *)&pnVar13[(long)local_108].m_backend.data;
        uVar21 = *(undefined8 *)((long)&pnVar13[(long)local_108].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x10);
        uVar22 = *(undefined8 *)puVar1;
        uVar23 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x20);
        uVar24 = *(undefined8 *)puVar1;
        uVar25 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x30);
        uVar26 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar26;
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = uVar24;
        *(undefined8 *)(puVar1 + 2) = uVar25;
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = uVar22;
        *(undefined8 *)(puVar1 + 2) = uVar23;
        *(undefined8 *)&pnVar30[(long)local_108].m_backend.data = uVar12;
        *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8) = uVar21;
        pnVar30[(long)local_108].m_backend.exp = pnVar13[(long)local_108].m_backend.exp;
        pnVar30[(long)local_108].m_backend.neg = pnVar13[(long)local_108].m_backend.neg;
        iVar27 = pnVar13[(long)local_108].m_backend.prec_elem;
        pnVar30[(long)local_108].m_backend.fpclass = pnVar13[(long)local_108].m_backend.fpclass;
        pnVar30[(long)local_108].m_backend.prec_elem = iVar27;
      }
      pnVar30 = (this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = pnVar30[(long)local_108].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar30[(long)local_108].m_backend.neg;
      iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar30[(long)local_108].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar27;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = uVar21;
      (newUBbound->m_backend).exp = pnVar30[(long)local_108].m_backend.exp;
      (newUBbound->m_backend).neg = pnVar30[(long)local_108].m_backend.neg;
      iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
      (newUBbound->m_backend).fpclass = pnVar30[(long)local_108].m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = iVar27;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = uVar21;
      (newLBbound->m_backend).exp = pnVar30[(long)local_108].m_backend.exp;
      (newLBbound->m_backend).neg = pnVar30[(long)local_108].m_backend.neg;
      iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
      (newLBbound->m_backend).fpclass = pnVar30[(long)local_108].m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = iVar27;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      SVar29 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar28);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar36] = SVar29;
      pcVar33 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar36].m_backend;
      ::soplex::infinity::__tls_init();
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems[0xe] = 0;
      local_158.data._M_elems[0xf] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,-*(double *)(in_FS_OFFSET + -8));
      if (((pcVar33->fpclass != cpp_dec_float_NaN) && (local_158.fpclass != cpp_dec_float_NaN)) &&
         (iVar28 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar33,&local_158), 0 < iVar28)) {
        pnVar30 = (this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar13 = (this->theLCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
        uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
        uVar22 = *(undefined8 *)puVar1;
        uVar23 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
        uVar24 = *(undefined8 *)puVar1;
        uVar25 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
        uVar26 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar26;
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = uVar24;
        *(undefined8 *)(puVar1 + 2) = uVar25;
        puVar1 = (uint *)((long)&pnVar13[(long)local_108].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = uVar22;
        *(undefined8 *)(puVar1 + 2) = uVar23;
        *(undefined8 *)&pnVar13[(long)local_108].m_backend.data = uVar12;
        *(undefined8 *)((long)&pnVar13[(long)local_108].m_backend.data + 8) = uVar21;
        pnVar13[(long)local_108].m_backend.exp = pnVar30[(long)local_108].m_backend.exp;
        pnVar13[(long)local_108].m_backend.neg = pnVar30[(long)local_108].m_backend.neg;
        iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
        pnVar13[(long)local_108].m_backend.fpclass = pnVar30[(long)local_108].m_backend.fpclass;
        pnVar13[(long)local_108].m_backend.prec_elem = iVar27;
      }
      pnVar30 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = pnVar30[(long)local_108].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar30[(long)local_108].m_backend.neg;
      iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar30[(long)local_108].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar27;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = uVar21;
      (newUBbound->m_backend).exp = pnVar30[(long)local_108].m_backend.exp;
      (newUBbound->m_backend).neg = pnVar30[(long)local_108].m_backend.neg;
      iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
      (newUBbound->m_backend).fpclass = pnVar30[(long)local_108].m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = iVar27;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[(long)local_108].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[(long)local_108].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[(long)local_108].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = uVar21;
      (newLBbound->m_backend).exp = pnVar30[(long)local_108].m_backend.exp;
      (newLBbound->m_backend).neg = pnVar30[(long)local_108].m_backend.neg;
      iVar27 = pnVar30[(long)local_108].m_backend.prec_elem;
      (newLBbound->m_backend).fpclass = pnVar30[(long)local_108].m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = iVar27;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      SVar29 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar28);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar36] = SVar29;
      pnVar30 = (this->thePvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_f8.data._M_elems._0_8_ = *(undefined8 *)&pnVar30[lVar36].m_backend.data;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar30[lVar36].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x10);
      local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x20);
      local_f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x30);
      local_f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_f8.exp = pnVar30[lVar36].m_backend.exp;
      local_f8.neg = pnVar30[lVar36].m_backend.neg;
      local_f8.fpclass = pnVar30[lVar36].m_backend.fpclass;
      local_f8.prec_elem = pnVar30[lVar36].m_backend.prec_elem;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 0x10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems[6] = 0;
      local_a8.data._M_elems[7] = 0;
      local_a8.data._M_elems[8] = 0;
      local_a8.data._M_elems[9] = 0;
      local_a8.data._M_elems[10] = 0;
      local_a8.data._M_elems[0xb] = 0;
      local_a8.data._M_elems[0xc] = 0;
      local_a8.data._M_elems[0xd] = 0;
      local_a8.data._M_elems._56_5_ = 0;
      local_a8.data._M_elems[0xf]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      if (&local_a8 == &leaveMax->m_backend) {
        leaveMax = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_f8;
      }
      else {
        local_a8.data._M_elems._56_5_ = local_f8.data._M_elems._56_5_;
        local_a8.data._M_elems[0xf]._1_3_ = local_f8.data._M_elems[0xf]._1_3_;
        local_a8.prec_elem = local_f8.prec_elem;
        local_a8.fpclass = local_f8.fpclass;
        local_a8.data._M_elems._0_8_ = local_f8.data._M_elems._0_8_;
        local_a8.data._M_elems._8_8_ = local_f8.data._M_elems._8_8_;
        local_a8.data._M_elems._16_8_ = local_f8.data._M_elems._16_8_;
        local_a8.data._M_elems._24_8_ = local_f8.data._M_elems._24_8_;
        local_a8.data._M_elems._32_8_ = local_f8.data._M_elems._32_8_;
        local_a8.data._M_elems._40_8_ = local_f8.data._M_elems._40_8_;
        local_a8.data._M_elems._48_8_ = local_f8.data._M_elems._48_8_;
        local_a8.exp = local_f8.exp;
        local_a8.neg = local_f8.neg;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_a8,&leaveMax->m_backend);
      if (local_a8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_158,0,(type *)0x0);
        iVar28 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_a8,&local_158);
        lVar35 = 0xbc0;
        if (0 < iVar28) goto LAB_0039e6a4;
      }
      lVar35 = 0xbd8;
LAB_0039e6a4:
      lVar35 = *(long *)((long)&(this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray + lVar35);
      lVar20 = lVar36 * 0x50;
      uVar12 = *(undefined8 *)(lVar35 + lVar20);
      uVar21 = ((undefined8 *)(lVar35 + lVar20))[1];
      puVar32 = (undefined8 *)(lVar35 + 0x10 + lVar20);
      uVar22 = *puVar32;
      uVar23 = puVar32[1];
      puVar32 = (undefined8 *)(lVar35 + 0x20 + lVar20);
      uVar24 = *puVar32;
      uVar25 = puVar32[1];
      puVar32 = (undefined8 *)(lVar35 + 0x30 + lVar20);
      uVar26 = puVar32[1];
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *puVar32;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = *(int *)(lVar35 + 0x40 + lVar20);
      (newCoPrhs->m_backend).neg = *(bool *)(lVar35 + 0x44 + lVar20);
      uVar12 = *(undefined8 *)(lVar35 + 0x48 + lVar20);
      (newCoPrhs->m_backend).fpclass = (int)uVar12;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar12 >> 0x20);
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[lVar36].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[lVar36].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = uVar21;
      (newUBbound->m_backend).exp = pnVar30[lVar36].m_backend.exp;
      (newUBbound->m_backend).neg = pnVar30[lVar36].m_backend.neg;
      iVar27 = pnVar30[lVar36].m_backend.prec_elem;
      (newUBbound->m_backend).fpclass = pnVar30[lVar36].m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = iVar27;
      pnVar30 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = *(undefined8 *)&pnVar30[lVar36].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar30[lVar36].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x20);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar30[lVar36].m_backend.data + 0x30);
      uVar26 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar26;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = uVar24;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 10) = uVar25;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = uVar22;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = uVar23;
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = uVar12;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = uVar21;
      (newLBbound->m_backend).exp = pnVar30[lVar36].m_backend.exp;
      (newLBbound->m_backend).neg = pnVar30[lVar36].m_backend.neg;
      iVar27 = pnVar30[lVar36].m_backend.prec_elem;
      (newLBbound->m_backend).fpclass = pnVar30[lVar36].m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = iVar27;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&enterBound->m_backend,0);
      return;
    }
    uVar12 = *(undefined8 *)(pnVar30 + (long)local_108);
    uVar21 = *(undefined8 *)((long)(pnVar30 + (long)local_108) + 8);
    uVar22 = *(undefined8 *)((long)(pnVar30 + (long)local_108) + 0x10);
    uVar23 = *(undefined8 *)((long)(pnVar30 + (long)local_108) + 0x18);
    uVar24 = *(undefined8 *)((long)(pnVar30 + (long)local_108) + 0x20);
    uVar25 = *(undefined8 *)((long)(pnVar30 + (long)local_108) + 0x28);
    uVar26 = *(undefined8 *)((long)(pnVar30 + (long)local_108) + 0x38);
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((long)(pnVar30 + (long)local_108) + 0x30);
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xe) = uVar26;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 8) = uVar24;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 10) = uVar25;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 4) = uVar22;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 6) = uVar23;
    *(undefined8 *)(enterBound->m_backend).data._M_elems = uVar12;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 2) = uVar21;
    (enterBound->m_backend).exp = *(int *)((long)(pnVar30 + (long)local_108) + 0x40);
    (enterBound->m_backend).neg = *(bool *)((long)(pnVar30 + (long)local_108) + 0x44);
    uVar12 = *(undefined8 *)((long)(pnVar30 + (long)local_108) + 0x48);
    (enterBound->m_backend).fpclass = (int)uVar12;
    (enterBound->m_backend).prec_elem = (int)((ulong)uVar12 >> 0x20);
    local_158.fpclass = cpp_dec_float_finite;
    local_158.prec_elem = 0x10;
    local_158.data._M_elems[0] = 0;
    local_158.data._M_elems[1] = 0;
    local_158.data._M_elems[2] = 0;
    local_158.data._M_elems[3] = 0;
    local_158.data._M_elems[4] = 0;
    local_158.data._M_elems[5] = 0;
    local_158.data._M_elems[6] = 0;
    local_158.data._M_elems[7] = 0;
    local_158.data._M_elems[8] = 0;
    local_158.data._M_elems[9] = 0;
    local_158.data._M_elems[10] = 0;
    local_158.data._M_elems[0xb] = 0;
    local_158.data._M_elems[0xc] = 0;
    local_158.data._M_elems[0xd] = 0;
    local_158.data._M_elems[0xe] = 0;
    local_158.data._M_elems[0xf] = 0;
    local_158.exp = 0;
    local_158.neg = false;
    if ((&local_158 != &enterBound->m_backend) &&
       (pcVar34 = &enterBound->m_backend, &local_158 != &newCoPrhs->m_backend)) {
      local_158.data._M_elems._0_8_ = *(undefined8 *)(newCoPrhs->m_backend).data._M_elems;
      local_158.data._M_elems._8_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2);
      local_158.data._M_elems._16_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4);
      local_158.data._M_elems._24_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6);
      local_158.data._M_elems._32_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8);
      uVar12 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10);
      uVar21 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc);
      uVar22 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe);
      local_158.data._M_elems[0xc] = (uint)uVar21;
      local_158.data._M_elems[0xd] = (uint)((ulong)uVar21 >> 0x20);
      local_158.data._M_elems[0xe] = (uint)uVar22;
      local_158.data._M_elems[0xf] = (uint)((ulong)uVar22 >> 0x20);
      local_158.data._M_elems[10] = (uint)uVar12;
      local_158.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
      local_158.exp = (newCoPrhs->m_backend).exp;
      local_158.neg = (newCoPrhs->m_backend).neg;
      local_158.fpclass = (newCoPrhs->m_backend).fpclass;
      local_158.prec_elem = (newCoPrhs->m_backend).prec_elem;
      pcVar34 = &enterBound->m_backend;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_158,pcVar34);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
            ((cpp_dec_float<100U,_int,_void> *)objChange,&local_158);
  return;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals2(
   R leaveMax,
   SPxId enterId,
   R& enterBound,
   R& newUBbound,
   R& newLBbound,
   R& newCoPrhs,
   StableSum<R>& objChange
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   enterBound = 0;

   if(enterId.isSPxRowId())
   {
      int idx = this->number(SPxRowId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);

         if(thePvec->delta()[idx] * leaveMax < 0)
            newCoPrhs = theLRbound[idx];
         else
            newCoPrhs = theURbound[idx];

         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLRbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theURbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * thePvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLRbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theURbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->lhs(idx) > R(-infinity))
            theURbound[idx] = theLRbound[idx];

         newCoPrhs = theLRbound[idx];        // slack !!
         newUBbound = -this->lhs(idx);
         newLBbound = -this->rhs(idx);
         enterBound = -this->rhs(idx);
         objChange -= newCoPrhs * this->rhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->rhs(idx) < R(infinity))
            theLRbound[idx] = theURbound[idx];

         newCoPrhs = theURbound[idx];        // slack !!
         newLBbound = -this->rhs(idx);
         newUBbound = -this->lhs(idx);
         enterBound = -this->lhs(idx);
         objChange -= newCoPrhs * this->lhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XLEAVE04 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "ELEAVE53 ERROR: not yet debugged!" << std::endl;)
         ds.rowStatus(idx) = this->dualRowStatus(idx);
         newCoPrhs = theURbound[idx];        // slack !!
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         enterBound = 0;
#endif
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE54 "
                       << "ERROR! Tried to put a fixed row variable into the basis: "
                       << "idx="   << idx
                       << ", lhs=" << this->lhs(idx)
                       << ", rhs=" << this->rhs(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE05 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE06 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(enterId.isSPxColId());
      int idx = this->number(SPxColId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theUCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         newCoPrhs = theLCbound[idx];
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * theCoPvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLCbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theUCbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::lower(idx) > R(-infinity))
            theLCbound[idx] = theUCbound[idx];

         newCoPrhs = theUCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::upper(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::upper(idx) < R(infinity))
            theUCbound[idx] = theLCbound[idx];

         newCoPrhs = theLCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::lower(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(thePvec->delta()[idx] * leaveMax > 0)
            newCoPrhs = theUCbound[idx];
         else
            newCoPrhs = theLCbound[idx];

         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = 0;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE56 "
                       << "ERROR! Tried to put a fixed column variable into the basis. "
                       << "idx="     << idx
                       << ", lower=" << this->lower(idx)
                       << ", upper=" << this->upper(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE07 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE08 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.colStatus(idx), objChange);
   }

}